

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_stroke_arc(nk_command_buffer *b,float cx,float cy,float radius,float a_min,float a_max,
                  float line_thickness,nk_color c)

{
  void *pvVar1;
  nk_command_arc *cmd;
  float line_thickness_local;
  float a_max_local;
  float a_min_local;
  float radius_local;
  float cy_local;
  float cx_local;
  nk_command_buffer *b_local;
  nk_color c_local;
  
  if ((((b != (nk_command_buffer *)0x0) && (b_local._7_1_ = c.a, b_local._7_1_ != '\0')) &&
      (0.0 < line_thickness)) &&
     (pvVar1 = nk_command_buffer_push(b,NK_COMMAND_ARC,0x28), pvVar1 != (void *)0x0)) {
    *(short *)((long)pvVar1 + 0x16) = (short)(int)line_thickness;
    *(short *)((long)pvVar1 + 0x10) = (short)(int)cx;
    *(short *)((long)pvVar1 + 0x12) = (short)(int)cy;
    *(short *)((long)pvVar1 + 0x14) = (short)(int)radius;
    *(float *)((long)pvVar1 + 0x18) = a_min;
    *(float *)((long)pvVar1 + 0x1c) = a_max;
    *(nk_color *)((long)pvVar1 + 0x20) = c;
  }
  return;
}

Assistant:

NK_API void
nk_stroke_arc(struct nk_command_buffer *b, float cx, float cy, float radius,
    float a_min, float a_max, float line_thickness, struct nk_color c)
{
    struct nk_command_arc *cmd;
    if (!b || c.a == 0 || line_thickness <= 0) return;
    cmd = (struct nk_command_arc*)
        nk_command_buffer_push(b, NK_COMMAND_ARC, sizeof(*cmd));
    if (!cmd) return;
    cmd->line_thickness = (unsigned short)line_thickness;
    cmd->cx = (short)cx;
    cmd->cy = (short)cy;
    cmd->r = (unsigned short)radius;
    cmd->a[0] = a_min;
    cmd->a[1] = a_max;
    cmd->color = c;
}